

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::MergeIfVisitor::get_targeted_if
               (StmtBlock *block,
               map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
               *result)

{
  bool bVar1;
  StatementType SVar2;
  VarType VVar3;
  __shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  element_type *this_00;
  element_type *this_01;
  element_type *peVar4;
  vector<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>>>
  *this_02;
  undefined1 local_b0 [48];
  Var *local_80;
  Var *target_var;
  undefined1 local_68 [8];
  shared_ptr<kratos::Expr> expr;
  shared_ptr<kratos::Var> predicate;
  shared_ptr<kratos::IfStmt> if_;
  shared_ptr<kratos::Stmt> *stmt;
  iterator __end2;
  iterator __begin2;
  StmtBlock *__range2;
  map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
  *result_local;
  StmtBlock *block_local;
  
  __end2 = StmtBlock::begin(block);
  stmt = (shared_ptr<kratos::Stmt> *)StmtBlock::end(block);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                *)&stmt);
    if (!bVar1) break;
    this = (__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
           ::operator*(&__end2);
    this_00 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this);
    SVar2 = Stmt::type(this_00);
    if (SVar2 == If) {
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (this);
      Stmt::as<kratos::IfStmt>
                ((Stmt *)&predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      IfStmt::predicate((IfStmt *)
                        &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      this_01 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      VVar3 = Var::type(this_01);
      if (VVar3 == Expression) {
        std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        Var::as<kratos::Expr>((Var *)local_68);
        peVar4 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_68);
        if (peVar4->op == Eq) {
          peVar4 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_68);
          if (peVar4->right != (Var *)0x0) {
            peVar4 = std::
                     __shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_68);
            VVar3 = Var::type(peVar4->right);
            if (VVar3 == ConstValue) {
              peVar4 = std::
                       __shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_68);
              local_80 = peVar4->left;
              this_02 = (vector<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>>>
                         *)std::
                           map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
                           ::operator[](result,&local_80);
              std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_68);
              Var::as<kratos::Const>((Var *)local_b0);
              std::make_pair<std::shared_ptr<kratos::IfStmt>&,std::shared_ptr<kratos::Const>>
                        ((pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_> *)
                         (local_b0 + 0x10),
                         (shared_ptr<kratos::IfStmt> *)
                         &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(shared_ptr<kratos::Const> *)local_b0);
              std::
              vector<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>>>
              ::
              emplace_back<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>>
                        (this_02,(pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>
                                  *)(local_b0 + 0x10));
              std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>::~pair
                        ((pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_> *)
                         (local_b0 + 0x10));
              std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)local_b0);
            }
          }
        }
        std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_68);
      }
      std::shared_ptr<kratos::Var>::~shared_ptr
                ((shared_ptr<kratos::Var> *)
                 &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<kratos::IfStmt>::~shared_ptr
                ((shared_ptr<kratos::IfStmt> *)
                 &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void static get_targeted_if(StmtBlock* block, std::map<Var*, std::vector<IfStmtType>>& result) {
        for (auto const& stmt : *block) {
            if (stmt->type() == StatementType::If) {
                auto if_ = stmt->as<IfStmt>();
                auto predicate = if_->predicate();
                if (predicate->type() == VarType::Expression) {
                    auto expr = predicate->as<Expr>();
                    if (expr->op == ExprOp::Eq && expr->right &&
                        expr->right->type() == VarType::ConstValue) {
                        // this is what we want
                        auto* target_var = expr->left;
                        result[target_var].emplace_back(
                            std::make_pair(if_, expr->right->as<Const>()));
                    }
                }
            }
        }
    }